

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O2

void __thiscall TPZStream::Read(TPZStream *this,string *p,int howMany)

{
  int iVar1;
  undefined8 in_RAX;
  void *pvVar2;
  ulong uVar3;
  undefined4 uStack_38;
  int stringSize;
  
  uVar3 = (ulong)(uint)howMany;
  _uStack_38 = in_RAX;
  if (howMany < 1) {
    uVar3 = 0;
  }
  while (uVar3 != 0) {
    p->_M_string_length = 0;
    *(p->_M_dataplus)._M_p = '\0';
    _uStack_38 = CONCAT44(0xffffffff,uStack_38);
    (*this->_vptr_TPZStream[0x1d])(this,&stringSize,1);
    iVar1 = stringSize;
    pvVar2 = operator_new__((long)stringSize + 1);
    (*this->_vptr_TPZStream[0x25])(this,pvVar2,(ulong)(uint)iVar1);
    *(undefined1 *)((long)pvVar2 + (long)stringSize) = 0;
    std::__cxx11::string::assign((char *)p);
    operator_delete(pvVar2,1);
    p = p + 1;
    uVar3 = uVar3 - 1;
  }
  return;
}

Assistant:

void TPZStream::Read(std::string *p, int howMany) {
    char *temp;
    for (int c = 0; c < howMany; c++) {
        p[c].clear();
        int stringSize = -1;
        Read(&stringSize, 1);
        temp = new char[stringSize+1];
        Read(temp, stringSize);
        temp[stringSize] = 0;
        p[c] = temp;
        delete temp;
    }
}